

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

ExprError *
anon_unknown.dwarf_ff84f::ReportExpected
          (ExpressionContext *ctx,SynBase *source,TypeBase *type,char *msg,...)

{
  char in_AL;
  int iVar1;
  undefined4 extraout_var;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  undefined1 local_c8 [32];
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  args[0].reg_save_area = local_c8;
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  args[0].overflow_arg_area = &stack0x00000008;
  args[0].gp_offset = 0x20;
  args[0].fp_offset = 0x30;
  local_a8 = in_R8;
  local_a0 = in_R9;
  ReportAt(ctx,source,(source->pos).begin,msg,args);
  iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
  ExprError::ExprError((ExprError *)CONCAT44(extraout_var,iVar1),source,type);
  return (ExprError *)CONCAT44(extraout_var,iVar1);
}

Assistant:

ExprError* ReportExpected(ExpressionContext &ctx, SynBase *source, TypeBase *type, const char *msg, ...)
	{
		va_list args;
		va_start(args, msg);

		ReportAt(ctx, source, source->pos.begin, msg, args);

		va_end(args);

		return new (ctx.get<ExprError>()) ExprError(source, type);
	}